

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_uint_vector.h
# Opt level: O2

void s2coding::EncodeUintWithLength<unsigned_long_long>
               (unsigned_long_long value,int length,Encoder *encoder)

{
  size_t sVar1;
  S2LogMessage local_30;
  
  if ((uint)length < 9) {
    sVar1 = Encoder::avail(encoder);
    if (sVar1 < (uint)length) {
      S2LogMessage::S2LogMessage
                (&local_30,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
                 ,0x86,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_30.stream_,"Check failed: (encoder->avail()) >= (length) ");
    }
    else {
      for (; 0 < length; length = length + -1) {
        Encoder::put8(encoder,(uchar)value);
        value = value >> 8;
      }
      if (value == 0) {
        return;
      }
      S2LogMessage::S2LogMessage
                (&local_30,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
                 ,0x8c,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_30.stream_,"Check failed: (value) == (0) ");
    }
  }
  else {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
               ,0x85,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_30.stream_,"Check failed: length >= 0 && length <= sizeof(T) ");
  }
  abort();
}

Assistant:

inline void EncodeUintWithLength(T value, int length, Encoder* encoder) {
  static_assert(std::is_unsigned<T>::value, "Unsupported signed integer");
  static_assert(sizeof(T) & 0xe, "Unsupported integer length");
  S2_DCHECK(length >= 0 && length <= sizeof(T));
  S2_DCHECK_GE(encoder->avail(), length);

  while (--length >= 0) {
    encoder->put8(value);
    value >>= 8;
  }
  S2_DCHECK_EQ(value, 0);
}